

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O2

ostream * operator<<(ostream *os,
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                    *kv)

{
  long lVar1;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffec8;
  UniValue in_stack_fffffffffffffee8;
  string local_b8 [32];
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  SettingsValue out;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = local_88;
  local_90 = 0;
  local_88[0] = 0;
  UniValue::UniValue(&out,VOBJ,in_stack_fffffffffffffec8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string(local_b8,&kv->first);
  UniValue::UniValue((UniValue *)&stack0xfffffffffffffef0,&kv->second);
  UniValue::pushKVEnd(&out,in_stack_fffffffffffffec8,in_stack_fffffffffffffee8);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffef0);
  std::__cxx11::string::~string(local_b8);
  UniValue::write_abi_cxx11_((UniValue *)&stack0xfffffffffffffed0,(int)&out,(void *)0x0,0);
  std::operator<<(os,(string *)&stack0xfffffffffffffed0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
  UniValue::~UniValue(&out);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return os;
  }
  __stack_chk_fail();
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, const std::pair<std::string, common::SettingsValue>& kv)
{
    common::SettingsValue out(common::SettingsValue::VOBJ);
    out.pushKVEnd(kv.first, kv.second);
    os << out.write();
    return os;
}